

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall
kj::Vector<capnp::Orphan<capnp::compiler::Statement>_>::~Vector
          (Vector<capnp::Orphan<capnp::compiler::Statement>_> *this)

{
  Orphan<capnp::compiler::Statement> *pOVar1;
  RemoveConst<capnp::Orphan<capnp::compiler::Statement>_> *pRVar2;
  Orphan<capnp::compiler::Statement> *pOVar3;
  ArrayDisposer *pAVar4;
  
  pOVar1 = (this->builder).ptr;
  if (pOVar1 != (Orphan<capnp::compiler::Statement> *)0x0) {
    pRVar2 = (this->builder).pos;
    pOVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Orphan<capnp::compiler::Statement> *)0x0;
    (this->builder).pos = (RemoveConst<capnp::Orphan<capnp::compiler::Statement>_> *)0x0;
    (this->builder).endPtr = (Orphan<capnp::compiler::Statement> *)0x0;
    pAVar4 = (this->builder).disposer;
    (**pAVar4->_vptr_ArrayDisposer)
              (pAVar4,pOVar1,0x20,(long)pRVar2 - (long)pOVar1 >> 5,(long)pOVar3 - (long)pOVar1 >> 5,
               ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Statement>_>::destruct);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }